

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 tcu::lookup(ConstPixelBufferAccess *access,int i,int j,int k)

{
  bool bVar1;
  ChannelType CVar2;
  undefined4 in_register_00000034;
  TextureFormat *pTVar3;
  undefined1 auVar5 [12];
  undefined8 uVar6;
  Vec4 VVar4;
  
  pTVar3 = (TextureFormat *)CONCAT44(in_register_00000034,i);
  bVar1 = isSRGB(*pTVar3);
  if (bVar1) {
    CVar2 = pTVar3->type ^ UNORM_INT8;
    if (pTVar3->order == sRGB && CVar2 == SNORM_INT8) {
      ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,i,j,k);
      VVar4 = sRGB8ToLinear((UVec4 *)&stack0xffffffffffffffc0);
    }
    else if (CVar2 == SNORM_INT8 && pTVar3->order == sRGBA) {
      ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,i,j,k);
      VVar4 = sRGBA8ToLinear((UVec4 *)&stack0xffffffffffffffc0);
    }
    else {
      ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,i,j,k);
      VVar4 = sRGBToLinear((tcu *)access,(Vec4 *)&stack0xffffffffffffffc0);
    }
    VVar4.m_data[0] = VVar4.m_data[0];
    auVar5._4_4_ = VVar4.m_data[1];
    register0x00001240 = VVar4.m_data[2];
    register0x00001244 = VVar4.m_data[3];
    return (Vec4)VVar4.m_data;
  }
  VVar4 = ConstPixelBufferAccess::getPixel(access,i,j,k);
  return (Vec4)VVar4.m_data;
}

Assistant:

static inline Vec4 lookup (const ConstPixelBufferAccess& access, int i, int j, int k)
{
	const TextureFormat&	format	= access.getFormat();

	if (isSRGB(format))
	{
		if (format.type == TextureFormat::UNORM_INT8 && format.order == TextureFormat::sRGB)
				return sRGB8ToLinear(access.getPixelUint(i, j, k));
		else if (format.type == TextureFormat::UNORM_INT8 && format.order == TextureFormat::sRGBA)
				return sRGBA8ToLinear(access.getPixelUint(i, j, k));
		else
			return sRGBToLinear(access.getPixel(i, j, k));
	}
	else
	{
		return access.getPixel(i, j, k);
	}
}